

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

ll_elem * ll_unlink_robust(ll_head *q_head,ll_elem *n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int inslock;
  bool bVar4;
  
  do {
    uVar2 = 0;
    do {
      LOCK();
      uVar3 = n->succ;
      bVar4 = uVar2 == uVar3;
      if (bVar4) {
        n->succ = uVar2 | 2;
        uVar3 = uVar2;
      }
      UNLOCK();
      if (bVar4) {
        do {
        } while (1 < n->pred);
        return (ll_elem *)0x0;
      }
      uVar2 = uVar3;
    } while (uVar3 < 2);
    iVar1 = unlink((char *)q_head);
    if (iVar1 != 0) {
      unlink_release((ll_head *)n,(ll_elem *)0x1,inslock);
      return n;
    }
  } while( true );
}

Assistant:

struct ll_elem*
ll_unlink_robust(struct ll_head *q_head, struct ll_elem *n)
{
	for (;;) {
		if (insert_lock(n))
			return NULL;

		if (unlink(q_head, n)) {
			unlink_release(q_head, n, 1);
			return n;
		}
		SPINWAIT();
	}
}